

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_getColName(void *highs,HighsInt col,char *name)

{
  _Alloc_hider _Var1;
  HighsStatus HVar2;
  string name_v;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  HVar2 = Highs::getColName((Highs *)highs,col,&local_40);
  _Var1._M_p = local_40._M_dataplus._M_p;
  strcpy(name,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != &local_40.field_2) {
    operator_delete(_Var1._M_p);
  }
  return HVar2;
}

Assistant:

HighsInt Highs_getColName(const void* highs, const HighsInt col, char* name) {
  std::string name_v;
  HighsInt retcode = (HighsInt)((Highs*)highs)->getColName(col, name_v);
  strcpy(name, name_v.c_str());
  return retcode;
}